

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O2

bool Assimp::SkipSpaces<char>(char *in,char **out)

{
  for (; (*in == 0x20 || (*in == 9)); in = (char *)((byte *)in + 1)) {
  }
  *out = in;
  return (bool)((byte)(0xbfe >> (*in & 0x1fU)) & 1 | 0xdU < (byte)*in);
}

Assistant:

AI_FORCE_INLINE
bool SkipSpaces( const char_t* in, const char_t** out) {
    while( *in == ( char_t )' ' || *in == ( char_t )'\t' ) {
        ++in;
    }
    *out = in;
    return !IsLineEnd<char_t>(*in);
}